

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.c
# Opt level: O1

int proxy_process(proxy_handle *ph)

{
  void *pvVar1;
  int iVar2;
  conn_handle *conn;
  long lVar3;
  char remote_addr [54];
  char local_68 [56];
  
  pvVar1 = ph->priv;
  local_68[0x20] = '\0';
  local_68[0x21] = '\0';
  local_68[0x22] = '\0';
  local_68[0x23] = '\0';
  local_68[0x24] = '\0';
  local_68[0x25] = '\0';
  local_68[0x26] = '\0';
  local_68[0x27] = '\0';
  local_68[0x28] = '\0';
  local_68[0x29] = '\0';
  local_68[0x2a] = '\0';
  local_68[0x2b] = '\0';
  local_68[0x2c] = '\0';
  local_68[0x2d] = '\0';
  local_68[0x10] = '\0';
  local_68[0x11] = '\0';
  local_68[0x12] = '\0';
  local_68[0x13] = '\0';
  local_68[0x14] = '\0';
  local_68[0x15] = '\0';
  local_68[0x16] = '\0';
  local_68[0x17] = '\0';
  local_68[0x18] = '\0';
  local_68[0x19] = '\0';
  local_68[0x1a] = '\0';
  local_68[0x1b] = '\0';
  local_68[0x1c] = '\0';
  local_68[0x1d] = '\0';
  local_68[0x1e] = '\0';
  local_68[0x1f] = '\0';
  local_68[0] = '\0';
  local_68[1] = '\0';
  local_68[2] = '\0';
  local_68[3] = '\0';
  local_68[4] = '\0';
  local_68[5] = '\0';
  local_68[6] = '\0';
  local_68[7] = '\0';
  local_68[8] = '\0';
  local_68[9] = '\0';
  local_68[10] = '\0';
  local_68[0xb] = '\0';
  local_68[0xc] = '\0';
  local_68[0xd] = '\0';
  local_68[0xe] = '\0';
  local_68[0xf] = '\0';
  local_68[0x2e] = '\0';
  local_68[0x2f] = '\0';
  local_68[0x30] = '\0';
  local_68[0x31] = '\0';
  local_68[0x32] = '\0';
  local_68[0x33] = '\0';
  local_68[0x34] = '\0';
  local_68[0x35] = '\0';
  conn = (conn_handle *)calloc(1,0x20);
  if (conn == (conn_handle *)0x0) {
    iVar2 = -0xc;
  }
  else {
    iVar2 = conn_init(conn);
    if (-1 < iVar2) {
      proxy_log(ph,LOG_LEVEL_DEBUG,"Waiting for a client...\n");
      iVar2 = conn_accept((conn_handle *)((long)pvVar1 + 0x840),conn);
      if (-1 < iVar2) {
        conn_get_remote_addr(conn,local_68);
        lVar3 = 0;
        proxy_log(ph,LOG_LEVEL_DEBUG,"Incoming connection from %s.\n",local_68);
        mutex_lock_shared((mutex_handle *)((long)pvVar1 + 0x870));
        mutex_lock((mutex_handle *)((long)pvVar1 + 0x880));
        if (0 < *(int *)((long)pvVar1 + 0x83c)) {
          lVar3 = *(long *)((long)pvVar1 + 0x820);
          if (lVar3 == 0) {
            lVar3 = 0;
          }
          else {
            *(undefined8 *)((long)pvVar1 + 0x820) = *(undefined8 *)(lVar3 + 0x10);
          }
        }
        mutex_unlock((mutex_handle *)((long)pvVar1 + 0x880));
        mutex_unlock_shared((mutex_handle *)((long)pvVar1 + 0x870));
        if (lVar3 == 0) {
          iVar2 = 0;
          proxy_log(ph,LOG_LEVEL_INFO,"Dropping client because there are no available slots.\n");
        }
        else {
          mutex_lock((mutex_handle *)(lVar3 + 0x18));
          iVar2 = -0x10;
          if (*(long *)(lVar3 + 8) == 0) {
            *(conn_handle **)(lVar3 + 8) = conn;
            iVar2 = worker_wake((worker_handle *)(lVar3 + 0x20));
            if (iVar2 < 0) {
              *(undefined8 *)(lVar3 + 8) = 0;
            }
          }
          mutex_unlock((mutex_handle *)(lVar3 + 0x18));
          if (-1 < iVar2) {
            return 0;
          }
        }
      }
      conn_free(conn);
    }
    free(conn);
  }
  return iVar2;
}

Assistant:

int proxy_process(struct proxy_handle *ph)
{
	struct proxy_priv *priv = ph->priv;
	struct conn_handle *conn;
	struct proxy_worker *worker = NULL;
	int ret = -EBUSY;
	char remote_addr[54] = { 0 };

	conn = calloc(1, sizeof(*conn));
	if (conn == NULL)
		return -ENOMEM;

	ret = conn_init(conn);
	if (ret < 0) {
		free(conn);
		return ret;
	}

	proxy_log(ph, LOG_LEVEL_DEBUG, "Waiting for a client...\n");

	ret = conn_accept(&priv->conn_listen, conn);
	if (ret < 0)
		goto conn_process_exit;

	conn_get_remote_addr(conn, remote_addr);
	proxy_log(ph, LOG_LEVEL_DEBUG, "Incoming connection from %s.\n",
		  remote_addr);

	mutex_lock_shared(&priv->usable_clients_mutex);
	mutex_lock(&priv->idle_workers_mutex);
	if (priv->usable_clients > 0 && priv->idle_workers_head != NULL) {
		worker = priv->idle_workers_head;
		priv->idle_workers_head = worker->next;
	}
	mutex_unlock(&priv->idle_workers_mutex);
	mutex_unlock_shared(&priv->usable_clients_mutex);

	if (worker == NULL) {
		proxy_log(ph, LOG_LEVEL_INFO,
			  "Dropping client because there are no available slots.\n");
		ret = 0;
		goto conn_process_exit;
	}

	ret = proxy_worker_accept(worker, conn);
	if (ret < 0)
		goto conn_process_exit;

	return 0;

conn_process_exit:
	conn_free(conn);
	free(conn);

	return ret;
}